

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::udp_tracker_connection::send_udp_scrape(udp_tracker_connection *this)

{
  tracker_manager *ptVar1;
  bool bVar2;
  unsigned_short uVar3;
  pointer ppVar4;
  tracker_request *ptVar5;
  const_iterator __first;
  const_iterator __last;
  char *pcVar6;
  ulong uVar7;
  listen_socket_handle *plVar8;
  int local_c4;
  seconds32 local_c0;
  int local_bc;
  seconds32 local_b8;
  undefined1 local_b1;
  size_t local_b0;
  int local_a8;
  undefined1 local_99;
  span<const_char> local_98;
  undefined1 local_88 [8];
  error_code ec;
  span<char> view;
  char buf [36];
  address local_38;
  _Self local_18;
  iterator i;
  udp_tracker_connection *this_local;
  
  if ((this->m_abort & 1U) == 0) {
    i._M_node = (_Base_ptr)this;
    boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address(&local_38,&this->m_target);
    local_18._M_node =
         (_Base_ptr)
         ::std::
         map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
         ::find((map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
                 *)m_connection_cache,&local_38);
    register0x00000000 =
         ::std::
         map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
         ::end((map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
                *)m_connection_cache);
    bVar2 = ::std::operator==(&local_18,(_Self *)(buf + 0x20));
    if (!bVar2) {
      span<char>::span<char,36l>((span<char> *)&ec.cat_,(char (*) [36])&view.m_len);
      ppVar4 = ::std::
               _Rb_tree_iterator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>
               ::operator->(&local_18);
      write_int64<long,char>((ppVar4->second).connection_id,(span<char> *)&ec.cat_);
      write_int32<libtorrent::aux::udp_tracker_connection::action_t,char>
                (scrape,(span<char> *)&ec.cat_);
      write_int32<unsigned_int,char>(this->m_transaction_id,(span<char> *)&ec.cat_);
      ptVar5 = tracker_connection::tracker_req(&this->super_tracker_connection);
      __first = digest32<160L>::begin(&ptVar5->info_hash);
      ptVar5 = tracker_connection::tracker_req(&this->super_tracker_connection);
      __last = digest32<160L>::end(&ptVar5->info_hash);
      pcVar6 = span<char>::data((span<char> *)&ec.cat_);
      ::std::copy<unsigned_char_const*,char*>(__first,__last,pcVar6);
      boost::system::error_code::error_code((error_code *)local_88);
      uVar7 = ::std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        ptVar1 = (this->super_tracker_connection).m_man;
        plVar8 = tracker_connection::bind_socket(&this->super_tracker_connection);
        pcVar6 = (char *)::std::__cxx11::string::c_str();
        uVar3 = boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::port(&this->m_target);
        span<char_const>::span<char,36l>((span<char_const> *)&local_98,(char (*) [36])&view.m_len);
        local_99 = 2;
        tracker_manager::send_hostname
                  (ptVar1,plVar8,pcVar6,(uint)uVar3,local_98,(error_code *)local_88,
                   (udp_send_flags_t)0x2);
      }
      else {
        ptVar1 = (this->super_tracker_connection).m_man;
        plVar8 = tracker_connection::bind_socket(&this->super_tracker_connection);
        span<char_const>::span<char,36l>((span<char_const> *)&local_b0,(char (*) [36])&view.m_len);
        local_b1 = 2;
        tracker_manager::send(ptVar1,(int)plVar8,&this->m_target,local_b0,local_a8);
      }
      this->m_state = scrape;
      tracker_connection::sent_bytes(&this->super_tracker_connection,0x40);
      this->m_attempts = this->m_attempts + 1;
      bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)local_88);
      if (bVar2) {
        local_bc = 0;
        ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<int,std::ratio<1l,1l>> *)&local_b8,&local_bc);
        local_c4 = 0x1e;
        ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<int,std::ratio<1l,1l>> *)&local_c0,&local_c4);
        fail(this,(error_code *)local_88,sock_write,"",local_b8,local_c0);
      }
    }
  }
  return;
}

Assistant:

void udp_tracker_connection::send_udp_scrape()
	{
		if (m_abort) return;

		auto const i = m_connection_cache.find(m_target.address());
		// this isn't really supposed to happen
		TORRENT_ASSERT(i != m_connection_cache.end());
		if (i == m_connection_cache.end()) return;

		char buf[8 + 4 + 4 + 20];
		span<char> view = buf;

		aux::write_int64(i->second.connection_id, view); // connection_id
		aux::write_int32(action_t::scrape, view); // action (scrape)
		aux::write_int32(m_transaction_id, view); // transaction_id
		// info_hash
		std::copy(tracker_req().info_hash.begin(), tracker_req().info_hash.end()
			, view.data());
#if TORRENT_USE_ASSERTS
		TORRENT_ASSERT(view.size() == 20);
#endif

		error_code ec;
		if (!m_hostname.empty())
		{
			m_man.send_hostname(bind_socket(), m_hostname.c_str(), m_target.port()
				, buf, ec, udp_socket::tracker_connection);
		}
		else
		{
			m_man.send(bind_socket(), m_target, buf, ec
				, udp_socket::tracker_connection);
		}
		m_state = action_t::scrape;
		sent_bytes(sizeof(buf) + 28); // assuming UDP/IP header
		++m_attempts;
		if (ec)
		{
			fail(ec, operation_t::sock_write);
			return;
		}
	}